

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

size_t gguf_get_meta_size(gguf_context *ctx)

{
  size_t sVar1;
  vector<signed_char,_std::allocator<signed_char>_> buf;
  
  buf.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  buf.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  buf.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  gguf_write_to_buf(ctx,&buf,true);
  sVar1 = (long)buf.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)buf.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            (&buf.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  return sVar1;
}

Assistant:

size_t gguf_get_meta_size(const struct gguf_context * ctx) {
    // only return size
    std::vector<int8_t> buf;
    gguf_write_to_buf(ctx, buf, /*only_meta =*/ true);
    return buf.size();
}